

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

uint16_t icu_63::getAlgName(AlgorithmicRange *range,uint32_t code,UCharNameChoice nameChoice,
                           char *buffer,uint16_t bufferLength)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t *puStack_70;
  char c_1;
  char *s_1;
  uint16_t count_1;
  uint16_t *factors;
  uint16_t indexes [8];
  ushort local_3c;
  char local_39;
  uint16_t count;
  uint16_t i;
  AlgorithmicRange *pAStack_38;
  char c;
  char *s;
  uint16_t bufferPos;
  char *pcStack_28;
  uint16_t bufferLength_local;
  char *buffer_local;
  UCharNameChoice nameChoice_local;
  uint32_t code_local;
  AlgorithmicRange *range_local;
  
  s._4_2_ = 0;
  if ((nameChoice == U_UNICODE_CHAR_NAME) || (nameChoice == U_EXTENDED_CHAR_NAME)) {
    s._6_2_ = bufferLength;
    pcStack_28 = buffer;
    if (range->type == '\0') {
      pAStack_38 = range + 1;
      while( true ) {
        cVar1 = (char)pAStack_38->start;
        if (cVar1 == '\0') break;
        if (s._6_2_ != 0) {
          *pcStack_28 = cVar1;
          s._6_2_ = s._6_2_ - 1;
          pcStack_28 = pcStack_28 + 1;
        }
        s._4_2_ = s._4_2_ + 1;
        pAStack_38 = (AlgorithmicRange *)((long)&pAStack_38->start + 1);
      }
      uVar3 = (ushort)range->variant;
      local_3c = uVar3;
      buffer_local._4_4_ = code;
      if (uVar3 < s._6_2_) {
        pcStack_28[uVar3] = '\0';
      }
      while (local_3c != 0) {
        local_3c = local_3c - 1;
        if (local_3c < s._6_2_) {
          bVar2 = (byte)buffer_local._4_4_ & 0xf;
          if (bVar2 < 10) {
            local_39 = bVar2 + 0x30;
          }
          else {
            local_39 = bVar2 + 0x37;
          }
          pcStack_28[local_3c] = local_39;
        }
        buffer_local._4_4_ = buffer_local._4_4_ >> 4;
      }
      s._4_2_ = s._4_2_ + uVar3;
    }
    else if (range->type == '\x01') {
      bVar2 = range->variant;
      puStack_70 = (uint16_t *)((long)&range[1].start + (long)(int)(uint)(ushort)bVar2 * 2);
      while( true ) {
        if ((char)*puStack_70 == '\0') break;
        if (s._6_2_ != 0) {
          *pcStack_28 = (char)*puStack_70;
          s._6_2_ = s._6_2_ - 1;
          pcStack_28 = pcStack_28 + 1;
        }
        s._4_2_ = s._4_2_ + 1;
        puStack_70 = (uint16_t *)((long)puStack_70 + 1);
      }
      uVar4 = writeFactorSuffix((uint16_t *)(range + 1),(ushort)bVar2,(char *)((long)puStack_70 + 1)
                                ,code - range->start,(uint16_t *)&factors,(char **)0x0,(char **)0x0,
                                pcStack_28,s._6_2_);
      s._4_2_ = s._4_2_ + uVar4;
    }
    else if (bufferLength != 0) {
      *buffer = '\0';
    }
    range_local._6_2_ = s._4_2_;
  }
  else {
    if (bufferLength != 0) {
      *buffer = '\0';
    }
    range_local._6_2_ = 0;
  }
  return range_local._6_2_;
}

Assistant:

static uint16_t
getAlgName(AlgorithmicRange *range, uint32_t code, UCharNameChoice nameChoice,
        char *buffer, uint16_t bufferLength) {
    uint16_t bufferPos=0;

    /* Only the normative character name can be algorithmic. */
    if(nameChoice!=U_UNICODE_CHAR_NAME && nameChoice!=U_EXTENDED_CHAR_NAME) {
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        return 0;
    }

    switch(range->type) {
    case 0: {
        /* name = prefix hex-digits */
        const char *s=(const char *)(range+1);
        char c;

        uint16_t i, count;

        /* copy prefix */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        /* write hexadecimal code point value */
        count=range->variant;

        /* zero-terminate */
        if(count<bufferLength) {
            buffer[count]=0;
        }

        for(i=count; i>0;) {
            if(--i<bufferLength) {
                c=(char)(code&0xf);
                if(c<10) {
                    c+='0';
                } else {
                    c+='A'-10;
                }
                buffer[i]=c;
            }
            code>>=4;
        }

        bufferPos+=count;
        break;
    }
    case 1: {
        /* name = prefix factorized-elements */
        uint16_t indexes[8];
        const uint16_t *factors=(const uint16_t *)(range+1);
        uint16_t count=range->variant;
        const char *s=(const char *)(factors+count);
        char c;

        /* copy prefix */
        while((c=*s++)!=0) {
            WRITE_CHAR(buffer, bufferLength, bufferPos, c);
        }

        bufferPos+=writeFactorSuffix(factors, count,
                                     s, code-range->start, indexes, NULL, NULL, buffer, bufferLength);
        break;
    }
    default:
        /* undefined type */
        /* zero-terminate */
        if(bufferLength>0) {
            *buffer=0;
        }
        break;
    }

    return bufferPos;
}